

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O2

bool chrono::utils::Validate
               (Data *sim_data,Data *ref_data,ChNormType norm_type,double tolerance,
               DataVector *norms)

{
  double *pdVar1;
  bool bVar2;
  size_t sVar3;
  ChValidation validator;
  ChValidation local_b8;
  
  local_b8.m_INF_norms._M_size = 0;
  local_b8.m_INF_norms._M_data = (double *)0x0;
  local_b8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_ref_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_L2_norms._M_size = 0;
  local_b8.m_L2_norms._M_data = (double *)0x0;
  local_b8.m_RMS_norms._M_size = 0;
  local_b8.m_RMS_norms._M_data = (double *)0x0;
  local_b8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_sim_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_ref_headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_sim_data.
  super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = ChValidation::Process(&local_b8,sim_data,ref_data);
  if (bVar2) {
    std::valarray<double>::resize(norms,local_b8.m_num_cols - 1,0.0);
    if (norm_type < (INF_NORM|RMS_NORM)) {
      std::valarray<double>::operator=
                (norms,(valarray<double> *)
                       ((long)&local_b8.m_L2_norms._M_size + (ulong)(norm_type << 4)));
    }
    sVar3 = 0;
    do {
      bVar2 = local_b8.m_num_cols - 1 == sVar3;
      if (bVar2) break;
      pdVar1 = norms->_M_data + sVar3;
      sVar3 = sVar3 + 1;
    } while (*pdVar1 <= tolerance);
  }
  else {
    bVar2 = false;
  }
  ChValidation::~ChValidation(&local_b8);
  return bVar2;
}

Assistant:

ChApi bool Validate(const Data& sim_data,
                    const Data& ref_data,
                    ChNormType norm_type,
                    double tolerance,
                    DataVector& norms) {
    ChValidation validator;

    if (!validator.Process(sim_data, ref_data))
        return false;

    size_t num_cols = validator.GetNumColumns() - 1;
    norms.resize(num_cols);

    switch (norm_type) {
        case L2_NORM:
            norms = validator.GetL2norms();
            break;
        case RMS_NORM:
            norms = validator.GetRMSnorms();
            break;
        case INF_NORM:
            norms = validator.GetINFnorms();
            break;
    }

    for (size_t col = 0; col < num_cols; col++) {
        if (norms[col] > tolerance)
            return false;
    }

    return true;
}